

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraInd.c
# Opt level: O1

Aig_Man_t * Fra_FraigInduction(Aig_Man_t *pManAig,Fra_Ssw_t *pParams)

{
  int iVar1;
  uint uVar2;
  void *pvVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  Aig_Man_t *pAVar9;
  Fra_Man_t *p;
  Fra_Sml_t *pFVar10;
  Vec_Int_t *pVVar11;
  Cnf_Dat_t *p_00;
  sat_solver *psVar12;
  Aig_Man_t *pMan;
  Vec_Ptr_t *pVVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  int level;
  Fra_Cla_t *pFVar17;
  char *__s;
  Fra_Man_t *pFVar18;
  Aig_Obj_t *pAVar19;
  long lVar20;
  float fVar21;
  timespec ts_2;
  Fra_Par_t Pars;
  undefined1 local_e0 [16];
  Vec_Ptr_t *local_d0;
  Aig_Man_t *local_c8;
  int local_bc;
  int local_b8;
  int local_b4;
  Aig_Obj_t *local_b0;
  anon_union_8_2_c1dd1440_for_Aig_Obj_t__0 local_a8;
  Aig_Obj_t *local_a0;
  int local_74;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  
  iVar4 = clock_gettime(3,(timespec *)&local_a8);
  if (iVar4 < 0) {
    pAVar19 = (Aig_Obj_t *)0xffffffffffffffff;
  }
  else {
    pAVar19 = (Aig_Obj_t *)
              ((long)local_a0 / 1000 + CONCAT44(local_a8._4_4_,local_a8.CioId) * 1000000);
  }
  fVar21 = pParams->TimeLimit;
  if ((fVar21 != 0.0) || (NAN(fVar21))) {
    local_d0 = (Vec_Ptr_t *)CONCAT44(local_d0._4_4_,fVar21);
    iVar4 = clock_gettime(3,(timespec *)&local_a8);
    if (iVar4 < 0) {
      fVar21 = -1.0;
    }
    else {
      fVar21 = (float)((long)local_a0 / 1000 + CONCAT44(local_a8._4_4_,local_a8.CioId) * 1000000);
    }
    local_d0 = (Vec_Ptr_t *)(long)(local_d0._0_4_ * 1e+06 + fVar21);
  }
  else {
    local_d0 = (Vec_Ptr_t *)0x0;
  }
  if (pManAig->nObjs[6] + pManAig->nObjs[5] == 0) {
    pParams->nIters = 0;
    Aig_ManReprStart(pManAig,pManAig->vObjs->nSize);
    pAVar9 = Aig_ManDupOrdered(pManAig);
    return pAVar9;
  }
  if (pManAig->nRegs < 1) {
    __assert_fail("Aig_ManRegNum(pManAig) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraInd.c"
                  ,0x174,"Aig_Man_t *Fra_FraigInduction(Aig_Man_t *, Fra_Ssw_t *)");
  }
  if (pParams->nFramesK < 1) {
    __assert_fail("pParams->nFramesK > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraInd.c"
                  ,0x175,"Aig_Man_t *Fra_FraigInduction(Aig_Man_t *, Fra_Ssw_t *)");
  }
  if ((pParams->fWriteImps != 0) && (0 < pParams->nPartSize)) {
    pParams->nPartSize = 0;
    puts("Partitioning was disabled to allow implication writing.");
  }
  if (((0 < pParams->nPartSize) && (pParams->nPartSize < pManAig->nRegs)) ||
     ((pManAig->vClockDoms != (Vec_Vec_t *)0x0 && (0 < pManAig->vClockDoms->nSize)))) {
    pAVar9 = Fra_FraigInductionPart(pManAig,pParams);
    return pAVar9;
  }
  iVar4 = pManAig->nRegs;
  iVar6 = pManAig->nObjs[6];
  iVar1 = pManAig->nObjs[5];
  local_c8 = pManAig;
  Fra_ParamsDefaultSeq((Fra_Par_t *)&local_a8);
  pAVar9 = local_c8;
  local_5c = pParams->nFramesP;
  local_58 = pParams->nFramesK;
  local_54 = pParams->nMaxImps;
  local_50 = pParams->nMaxLevs;
  local_74 = pParams->fVerbose;
  local_4c = pParams->fRewrite;
  local_48 = pParams->fLatchCorr;
  local_44 = pParams->fUseImps;
  local_3c = pParams->fWriteImps;
  local_40 = pParams->fUse1Hot;
  if (local_40 != 0 && 0 < local_5c) {
    __assert_fail("!(pPars->nFramesP > 0 && pPars->fUse1Hot)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraInd.c"
                  ,0x195,"Aig_Man_t *Fra_FraigInduction(Aig_Man_t *, Fra_Ssw_t *)");
  }
  local_b0 = pAVar19;
  if (1 < local_58 && local_40 != 0) {
    __assert_fail("!(pPars->nFramesK > 1 && pPars->fUse1Hot)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraInd.c"
                  ,0x196,"Aig_Man_t *Fra_FraigInduction(Aig_Man_t *, Fra_Ssw_t *)");
  }
  p = Fra_ManStart(local_c8,(Fra_Par_t *)&local_a8);
  p->pPars->nBTLimitNode = 0;
  if (local_74 != 0) {
    printf("Simulating %d AIG nodes for %d cycles ... ",
           (ulong)(uint)(pAVar9->nObjs[6] + pAVar9->nObjs[5]),(ulong)(local_5c + 0x20));
  }
  pFVar10 = Fra_SmlSimulateSeq(pAVar9,local_5c,0x20,1,1);
  p->pSml = pFVar10;
  if (local_74 != 0) {
    Abc_Print((int)pAVar9,"%s =","Time");
    level = 3;
    iVar5 = clock_gettime(3,(timespec *)local_e0);
    if (iVar5 < 0) {
      lVar14 = -1;
    }
    else {
      lVar14 = (long)local_e0._8_8_ / 1000 + local_e0._0_8_ * 1000000;
    }
    Abc_Print(level,"%9.2f sec\n",(double)(lVar14 - (long)local_b0) / 1000000.0);
  }
  Fra_ClassesPrepare(p->pCla,p->pPars->fLatchCorr,p->pPars->nMaxLevs);
  if (p->pPars->fUse1Hot != 0) {
    pVVar11 = Fra_OneHotCompute(p,p->pSml);
    p->vOneHots = pVVar11;
  }
  Fra_SmlStop(p->pSml);
  pFVar10 = Fra_SmlStart(local_c8,0,local_58 + 1,local_a8.CioId);
  p->pSml = pFVar10;
  if (local_44 != 0) {
    pVVar11 = Fra_ImpDerive(p,5000000,local_54,local_48);
    p->pCla->vImps = pVVar11;
  }
  if ((pParams->TimeLimit != 0.0) || (NAN(pParams->TimeLimit))) {
    iVar5 = clock_gettime(3,(timespec *)local_e0);
    if (iVar5 < 0) {
      lVar14 = -1;
    }
    else {
      lVar14 = (long)local_e0._8_8_ / 1000 + local_e0._0_8_ * 1000000;
    }
    if ((long)local_d0 < lVar14) {
      uVar16 = 0xffffffff;
      if (pParams->fSilent == 0) {
        puts("Fra_FraigInduction(): Runtime limit exceeded.");
      }
LAB_005fdbc6:
      pAVar9 = (Aig_Man_t *)0x0;
      goto LAB_005fdda7;
    }
  }
  Fra_BmcPerform(p,local_5c,local_58 + 1);
  iVar5 = Fra_ClassesCountLits(p->pCla);
  p->nLitsBeg = iVar5;
  p->nNodesBeg = iVar6 + iVar1;
  p->nRegsBeg = iVar4;
  pFVar17 = p->pCla;
  pFVar17->fRefinement = 1;
  uVar16 = 0;
  do {
    local_b4 = Fra_ClassesCountLits(pFVar17);
    pVVar11 = p->pCla->vImps;
    local_b8 = 0;
    if (pVVar11 != (Vec_Int_t *)0x0) {
      local_b8 = pVVar11->nSize;
    }
    if (p->vOneHots == (Vec_Int_t *)0x0) {
      iVar4 = 0;
    }
    else {
      iVar4 = Fra_OneHotCount(p,p->vOneHots);
    }
    iVar6 = clock_gettime(3,(timespec *)local_e0);
    if (iVar6 < 0) {
      lVar14 = 1;
    }
    else {
      lVar14 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816((long)local_e0._8_8_),8);
      lVar14 = ((lVar14 >> 7) - (lVar14 >> 0x3f)) + local_e0._0_8_ * -1000000;
    }
    if ((pParams->TimeLimit != 0.0) || (NAN(pParams->TimeLimit))) {
      iVar6 = clock_gettime(3,(timespec *)local_e0);
      if (iVar6 < 0) {
        lVar15 = -1;
      }
      else {
        lVar15 = (long)local_e0._8_8_ / 1000 + local_e0._0_8_ * 1000000;
      }
      if (lVar15 <= (long)local_d0) goto LAB_005fd768;
      pAVar9 = (Aig_Man_t *)0x2;
      __s = "Fra_FraigInduction(): Runtime limit exceeded.";
      iVar4 = 2;
      if (pParams->fSilent == 0) {
LAB_005fdb95:
        puts(__s);
        iVar4 = (int)pAVar9;
      }
    }
    else {
LAB_005fd768:
      p->pCla->fRefinement = 0;
      local_bc = iVar4;
      iVar4 = clock_gettime(3,(timespec *)local_e0);
      if (iVar4 < 0) {
        lVar15 = 1;
      }
      else {
        lVar15 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816((long)local_e0._8_8_),8);
        lVar15 = ((lVar15 >> 7) - (lVar15 >> 0x3f)) + local_e0._0_8_ * -1000000;
      }
      pAVar9 = Fra_FramesWithClasses(p);
      p->pManFraig = pAVar9;
      iVar4 = clock_gettime(3,(timespec *)local_e0);
      if (iVar4 < 0) {
        lVar20 = -1;
      }
      else {
        lVar20 = (long)local_e0._8_8_ / 1000 + local_e0._0_8_ * 1000000;
      }
      p->timeTrav = p->timeTrav + lVar20 + lVar15;
      if (p->pPars->fRewrite != 0) {
        Fra_FraigInductionRewrite(p);
      }
      pAVar9 = p->pManFraig;
      if (local_44 == 0) {
        p_00 = Cnf_Derive(pAVar9,pAVar9->nRegs);
      }
      else {
        p_00 = Cnf_DeriveSimple(pAVar9,pAVar9->nRegs);
      }
      psVar12 = (sat_solver *)Cnf_DataWriteIntoSolver(p_00,1,0);
      p->pSat = psVar12;
      p->nSatVars = p_00->nVars;
      if (psVar12 == (sat_solver *)0x0) {
        __assert_fail("p->pSat != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraInd.c"
                      ,0x1fd,"Aig_Man_t *Fra_FraigInduction(Aig_Man_t *, Fra_Ssw_t *)");
      }
      if ((local_44 != 0) &&
         (Fra_ImpAddToSolver(p,p->pCla->vImps,p_00->pVarNums), p->pSat == (sat_solver *)0x0)) {
        puts("Fra_FraigInduction(): Adding implicationsn to CNF led to a conflict.");
      }
      pVVar13 = p->pManFraig->vObjs;
      iVar4 = pVVar13->nSize;
      if (0 < iVar4) {
        lVar15 = 0;
        do {
          if (pVVar13->pArray[lVar15] != (void *)0x0) {
            *(Fra_Man_t **)((long)pVVar13->pArray[lVar15] + 0x28) = p;
          }
          lVar15 = lVar15 + 1;
          pVVar13 = p->pManFraig->vObjs;
          iVar4 = pVVar13->nSize;
        } while (lVar15 < iVar4);
      }
      Fra_ManClean(p,iVar4 + p->pManAig->nObjs[5] + p->pManAig->nObjs[6]);
      pVVar13 = p->pManFraig->vObjs;
      if (0 < pVVar13->nSize) {
        lVar15 = 0;
        do {
          pvVar3 = pVVar13->pArray[lVar15];
          if (pvVar3 != (void *)0x0) {
            if (p_00->pVarNums[*(int *)((long)pvVar3 + 0x24)] != -1) {
              *(int *)(*(long *)(*(long *)((long)pvVar3 + 0x28) + 0x98) +
                      (long)*(int *)((long)pvVar3 + 0x24) * 4) =
                   p_00->pVarNums[*(int *)((long)pvVar3 + 0x24)];
              *(undefined8 *)
               (*(long *)(*(long *)((long)pvVar3 + 0x28) + 0x90) +
               (long)*(int *)((long)pvVar3 + 0x24) * 8) = 1;
            }
          }
          lVar15 = lVar15 + 1;
          pVVar13 = p->pManFraig->vObjs;
        } while (lVar15 < pVVar13->nSize);
      }
      Cnf_DataFree(p_00);
      if (p->pPars->fUse1Hot != 0) {
        Fra_OneHotAssume(p,p->vOneHots);
      }
      if (local_74 != 0) {
        pFVar17 = p->pCla;
        uVar8 = pFVar17->vClasses1->nSize;
        uVar2 = pFVar17->vClasses->nSize;
        uVar7 = Fra_ClassesCountLits(pFVar17);
        printf("%3d : C = %6d. Cl = %6d.  L = %6d. LR = %6d.  ",(ulong)uVar16,(ulong)uVar8,
               (ulong)uVar2,(ulong)uVar7,(ulong)(uint)p->pManFraig->nAsserts);
        pVVar11 = p->pCla->vImps;
        if (pVVar11 != (Vec_Int_t *)0x0) {
          printf("I = %6d. ",(ulong)(uint)pVVar11->nSize);
        }
        if (p->pPars->fUse1Hot != 0) {
          uVar8 = Fra_OneHotCount(p,p->vOneHots);
          printf("1h = %6d. ",(ulong)uVar8);
        }
        printf("NR = %6d. ",(ulong)(uint)(p->pManFraig->nObjs[6] + p->pManFraig->nObjs[5]));
      }
      pAVar9 = (Aig_Man_t *)local_e0;
      p->nSatCallsRecent = 0;
      p->nSatCallsSkipped = 0;
      clock_gettime(3,(timespec *)pAVar9);
      if (p->pPars->fUse1Hot != 0) {
        Fra_OneHotCheck(p,p->vOneHots);
      }
      pFVar18 = p;
      Fra_FraigSweep(p);
      if (local_74 != 0) {
        Abc_Print((int)pFVar18,"%s =","T");
        iVar6 = 3;
        iVar4 = clock_gettime(3,(timespec *)pAVar9);
        if (iVar4 < 0) {
          lVar15 = -1;
        }
        else {
          lVar15 = (long)local_e0._8_8_ / 1000 + local_e0._0_8_ * 1000000;
        }
        Abc_Print(iVar6,"%9.2f sec\n",(double)(lVar15 + lVar14) / 1000000.0);
      }
      Aig_ManStop(p->pManFraig);
      p->pManFraig = (Aig_Man_t *)0x0;
      sat_solver_delete(p->pSat);
      p->pSat = (sat_solver *)0x0;
      memset(p->pMemFraig,0,(long)p->nFramesAll * (long)p->nSizeAlloc * 8);
      if (p->vTimeouts != (Vec_Ptr_t *)0x0) {
        __assert_fail("p->vTimeouts == NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraInd.c"
                      ,0x23f,"Aig_Man_t *Fra_FraigInduction(Aig_Man_t *, Fra_Ssw_t *)");
      }
      iVar4 = 0;
      if ((p->pCla->fRefinement != 0) && (iVar6 = Fra_ClassesCountLits(p->pCla), local_b4 == iVar6))
      {
        pVVar11 = p->pCla->vImps;
        iVar4 = 0;
        iVar6 = 0;
        if (pVVar11 != (Vec_Int_t *)0x0) {
          iVar6 = pVVar11->nSize;
        }
        if (local_b8 == iVar6) {
          iVar4 = 0;
          iVar6 = 0;
          if (p->vOneHots != (Vec_Int_t *)0x0) {
            iVar6 = Fra_OneHotCount(p,p->vOneHots);
          }
          pAVar9 = (Aig_Man_t *)0x3;
          __s = "Fra_FraigInduction(): Internal error. The result may not verify.";
          if (local_bc == iVar6) goto LAB_005fdb95;
        }
      }
    }
    if (iVar4 != 0) {
      if (iVar4 == 1) {
        return pAVar9;
      }
      if (iVar4 == 2) goto LAB_005fdbc6;
      break;
    }
    uVar16 = uVar16 + 1;
    pFVar17 = p->pCla;
  } while (pFVar17->fRefinement != 0);
  iVar4 = clock_gettime(3,(timespec *)local_e0);
  if (iVar4 < 0) {
    lVar14 = 1;
  }
  else {
    lVar14 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816((long)local_e0._8_8_),8);
    lVar14 = ((lVar14 >> 7) - (lVar14 >> 0x3f)) + local_e0._0_8_ * -1000000;
  }
  if (((p->pPars->fWriteImps == 0) || (p->vOneHots == (Vec_Int_t *)0x0)) ||
     (iVar4 = Fra_OneHotCount(p,p->vOneHots), iVar4 == 0)) {
    Fra_ClassesSelectRepr(p->pCla);
    Fra_ClassesCopyReprs(p->pCla,p->vTimeouts);
    pAVar9 = Aig_ManDupRepr(local_c8,0);
  }
  else {
    local_d0 = (Vec_Ptr_t *)Ioa_FileNameGenericAppend(p->pManAig->pName,"_care.aig");
    printf("Care one-hotness clauses will be written into file \"%s\".\n",local_d0);
    pAVar9 = Aig_ManDupOrdered(local_c8);
    pMan = Fra_OneHotCreateExdc(p,p->vOneHots);
    Ioa_WriteAiger(pMan,(char *)local_d0,0,1);
    Aig_ManStop(pMan);
  }
  Aig_ManSeqCleanup(pAVar9);
  iVar4 = clock_gettime(3,(timespec *)local_e0);
  lVar20 = -1;
  lVar15 = -1;
  if (-1 < iVar4) {
    lVar15 = (long)local_e0._8_8_ / 1000 + local_e0._0_8_ * 1000000;
  }
  p->timeTrav = p->timeTrav + lVar15 + lVar14;
  iVar4 = clock_gettime(3,(timespec *)local_e0);
  if (-1 < iVar4) {
    lVar20 = (long)local_e0._8_8_ / 1000 + local_e0._0_8_ * 1000000;
  }
  p->timeTotal = lVar20 - (long)local_b0;
  iVar4 = Fra_ClassesCountLits(p->pCla);
  p->nLitsEnd = iVar4;
  p->nNodesEnd = pAVar9->nObjs[6] + pAVar9->nObjs[5];
  p->nRegsEnd = pAVar9->nRegs;
LAB_005fdda7:
  Fra_ManStop(p);
  pParams->nIters = uVar16;
  return pAVar9;
}

Assistant:

Aig_Man_t * Fra_FraigInduction( Aig_Man_t * pManAig, Fra_Ssw_t * pParams )
{
    int fUseSimpleCnf = 0;
    int fUseOldSimulation = 0;
    // other paramaters affecting performance
    // - presence of FRAIGing in Abc_NtkDarSeqSweep()
    // - using distance-1 patterns in Fra_SmlAssignDist1()
    // - the number of simulation patterns
    // - the number of BMC frames

    Fra_Man_t * p;
    Fra_Par_t Pars, * pPars = &Pars; 
    Aig_Obj_t * pObj;
    Cnf_Dat_t * pCnf;
    Aig_Man_t * pManAigNew = NULL;
    int nNodesBeg, nRegsBeg;
    int nIter = -1; // Suppress "might be used uninitialized"
    int i;
    abctime clk = Abc_Clock(), clk2;
    abctime TimeToStop = pParams->TimeLimit ? pParams->TimeLimit * CLOCKS_PER_SEC + Abc_Clock() : 0;

    if ( Aig_ManNodeNum(pManAig) == 0 )
    {
        pParams->nIters = 0;
        // Ntl_ManFinalize() needs the following to satisfy an assertion
        Aig_ManReprStart(pManAig,Aig_ManObjNumMax(pManAig));
        return Aig_ManDupOrdered(pManAig);
    }
    assert( Aig_ManRegNum(pManAig) > 0 );
    assert( pParams->nFramesK > 0 );
//Aig_ManShow( pManAig, 0, NULL );

    if ( pParams->fWriteImps && pParams->nPartSize > 0 )
    {
        pParams->nPartSize = 0;
        printf( "Partitioning was disabled to allow implication writing.\n" );
    }
    // perform partitioning
    if ( (pParams->nPartSize > 0 && pParams->nPartSize < Aig_ManRegNum(pManAig))
         || (pManAig->vClockDoms && Vec_VecSize(pManAig->vClockDoms) > 0)  )
        return Fra_FraigInductionPart( pManAig, pParams );
 
    nNodesBeg = Aig_ManNodeNum(pManAig);
    nRegsBeg  = Aig_ManRegNum(pManAig);

    // enhance the AIG by adding timeframes
//    Fra_FramesAddMore( pManAig, 3 );

    // get parameters
    Fra_ParamsDefaultSeq( pPars );
    pPars->nFramesP   = pParams->nFramesP;
    pPars->nFramesK   = pParams->nFramesK;
    pPars->nMaxImps   = pParams->nMaxImps;
    pPars->nMaxLevs   = pParams->nMaxLevs;
    pPars->fVerbose   = pParams->fVerbose;
    pPars->fRewrite   = pParams->fRewrite;
    pPars->fLatchCorr = pParams->fLatchCorr;
    pPars->fUseImps   = pParams->fUseImps;
    pPars->fWriteImps = pParams->fWriteImps;
    pPars->fUse1Hot   = pParams->fUse1Hot;

    assert( !(pPars->nFramesP > 0 && pPars->fUse1Hot) );
    assert( !(pPars->nFramesK > 1 && pPars->fUse1Hot) );
 
    // start the fraig manager for this run
    p = Fra_ManStart( pManAig, pPars );
    p->pPars->nBTLimitNode = 0;
    // derive and refine e-classes using K initialized frames
    if ( fUseOldSimulation )
    {
        if ( pPars->nFramesP > 0 )
        {
            pPars->nFramesP = 0;
            printf( "Fra_FraigInduction(): Prefix cannot be used.\n" );
        }
        p->pSml = Fra_SmlStart( pManAig, 0, pPars->nFramesK + 1, pPars->nSimWords );
        Fra_SmlSimulate( p, 1 );
    }
    else
    {
        // bug:  r iscas/blif/s5378.blif    ; st; ssw -v
        // bug:  r iscas/blif/s1238.blif    ; st; ssw -v
        // refine the classes with more simulation rounds
if ( pPars->fVerbose )
printf( "Simulating %d AIG nodes for %d cycles ... ", Aig_ManNodeNum(pManAig), pPars->nFramesP + 32 );
        p->pSml = Fra_SmlSimulateSeq( pManAig, pPars->nFramesP, 32, 1, 1  ); //pPars->nFramesK + 1, 1 );  
if ( pPars->fVerbose ) 
{
ABC_PRT( "Time", Abc_Clock() - clk );
}
        Fra_ClassesPrepare( p->pCla, p->pPars->fLatchCorr, p->pPars->nMaxLevs );
//        Fra_ClassesPostprocess( p->pCla );
        // compute one-hotness conditions
        if ( p->pPars->fUse1Hot )
            p->vOneHots = Fra_OneHotCompute( p, p->pSml );
        // allocate new simulation manager for simulating counter-examples
        Fra_SmlStop( p->pSml );
        p->pSml = Fra_SmlStart( pManAig, 0, pPars->nFramesK + 1, pPars->nSimWords );
    }

    // select the most expressive implications
    if ( pPars->fUseImps )
        p->pCla->vImps = Fra_ImpDerive( p, 5000000, pPars->nMaxImps, pPars->fLatchCorr );

    if ( pParams->TimeLimit != 0.0 && Abc_Clock() > TimeToStop )
    {
        if ( !pParams->fSilent )
            printf( "Fra_FraigInduction(): Runtime limit exceeded.\n" );
        goto finish;
    }

    // perform BMC (for the min number of frames)
    Fra_BmcPerform( p, pPars->nFramesP, pPars->nFramesK+1 ); // +1 is needed to prevent non-refinement
//Fra_ClassesPrint( p->pCla, 1 );
//    if ( p->vCex == NULL )
//        p->vCex = Vec_IntAlloc( 1000 );

    p->nLitsBeg  = Fra_ClassesCountLits( p->pCla );
    p->nNodesBeg = nNodesBeg; // Aig_ManNodeNum(pManAig);
    p->nRegsBeg  = nRegsBeg; // Aig_ManRegNum(pManAig);

    // dump AIG of the timeframes
//    pManAigNew = Fra_ClassesDeriveAig( p->pCla, pPars->nFramesK );
//    Aig_ManDumpBlif( pManAigNew, "frame_aig.blif", NULL, NULL );
//    Fra_ManPartitionTest2( pManAigNew );
//    Aig_ManStop( pManAigNew );
 
    // iterate the inductive case
    p->pCla->fRefinement = 1;
    for ( nIter = 0; p->pCla->fRefinement; nIter++ )
    {
        int nLitsOld = Fra_ClassesCountLits(p->pCla);
        int nImpsOld = p->pCla->vImps? Vec_IntSize(p->pCla->vImps) : 0;
        int nHotsOld = p->vOneHots? Fra_OneHotCount(p, p->vOneHots) : 0;
        abctime clk3 = Abc_Clock();

        if ( pParams->TimeLimit != 0.0 && Abc_Clock() > TimeToStop )
        {
            if ( !pParams->fSilent )
                printf( "Fra_FraigInduction(): Runtime limit exceeded.\n" );
            goto finish;
        }

        // mark the classes as non-refined
        p->pCla->fRefinement = 0;
        // derive non-init K-timeframes while implementing e-classes
clk2 = Abc_Clock();
        p->pManFraig = Fra_FramesWithClasses( p );
p->timeTrav += Abc_Clock() - clk2;
//Aig_ManDumpBlif( p->pManFraig, "testaig.blif", NULL, NULL );

        // perform AIG rewriting
        if ( p->pPars->fRewrite )
            Fra_FraigInductionRewrite( p );

        // convert the manager to SAT solver (the last nLatches outputs are inputs)
        if ( fUseSimpleCnf || pPars->fUseImps )
            pCnf = Cnf_DeriveSimple( p->pManFraig, Aig_ManRegNum(p->pManFraig) );
        else
            pCnf = Cnf_Derive( p->pManFraig, Aig_ManRegNum(p->pManFraig) );
//        Cnf_DataTranformPolarity( pCnf, 0 );
//Cnf_DataWriteIntoFile( pCnf, "temp.cnf", 1 );

        p->pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
        p->nSatVars = pCnf->nVars;
        assert( p->pSat != NULL );
        if ( p->pSat == NULL )
            printf( "Fra_FraigInduction(): Computed CNF is not valid.\n" );
        if ( pPars->fUseImps )
        {
            Fra_ImpAddToSolver( p, p->pCla->vImps, pCnf->pVarNums );
            if ( p->pSat == NULL )
                printf( "Fra_FraigInduction(): Adding implicationsn to CNF led to a conflict.\n" );
        }

        // set the pointers to the manager
        Aig_ManForEachObj( p->pManFraig, pObj, i )
            pObj->pData = p;

        // prepare solver for fraiging the last timeframe
        Fra_ManClean( p, Aig_ManObjNumMax(p->pManFraig) + Aig_ManNodeNum(p->pManAig) );

        // transfer PI/LO variable numbers
        Aig_ManForEachObj( p->pManFraig, pObj, i )
        {
            if ( pCnf->pVarNums[pObj->Id] == -1 )
                continue;
            Fra_ObjSetSatNum( pObj, pCnf->pVarNums[pObj->Id] );
            Fra_ObjSetFaninVec( pObj, (Vec_Ptr_t *)1 );
        }
        Cnf_DataFree( pCnf );

        // add one-hotness clauses
        if ( p->pPars->fUse1Hot )
            Fra_OneHotAssume( p, p->vOneHots );
//        if ( p->pManAig->vOnehots )
//            Fra_OneHotAddKnownConstraint( p, p->pManAig->vOnehots );
 
        // report the intermediate results
        if ( pPars->fVerbose )
        {
            printf( "%3d : C = %6d. Cl = %6d.  L = %6d. LR = %6d.  ", 
                nIter, Vec_PtrSize(p->pCla->vClasses1), Vec_PtrSize(p->pCla->vClasses), 
                Fra_ClassesCountLits(p->pCla), p->pManFraig->nAsserts );
            if ( p->pCla->vImps )
                printf( "I = %6d. ", Vec_IntSize(p->pCla->vImps) );
            if ( p->pPars->fUse1Hot )
                printf( "1h = %6d. ", Fra_OneHotCount(p, p->vOneHots) );
            printf( "NR = %6d. ", Aig_ManNodeNum(p->pManFraig) );
//            printf( "\n" );
        } 

        // perform sweeping
        p->nSatCallsRecent = 0;
        p->nSatCallsSkipped = 0;
clk2 = Abc_Clock();
        if ( p->pPars->fUse1Hot )
            Fra_OneHotCheck( p, p->vOneHots );
        Fra_FraigSweep( p );
        if ( pPars->fVerbose )
        {
            ABC_PRT( "T", Abc_Clock() - clk3 );
        } 

//        Sat_SolverPrintStats( stdout, p->pSat );
        // remove FRAIG and SAT solver
        Aig_ManStop( p->pManFraig );   p->pManFraig = NULL;
//        printf( "Vars = %d. Clauses = %d. Learnts = %d.\n", p->pSat->size, p->pSat->clauses.size, p->pSat->learnts.size );
        sat_solver_delete( p->pSat );  p->pSat = NULL; 
        memset( p->pMemFraig, 0, sizeof(Aig_Obj_t *) * p->nSizeAlloc * p->nFramesAll );
//        printf( "Recent SAT called = %d. Skipped = %d.\n", p->nSatCallsRecent, p->nSatCallsSkipped );
        assert( p->vTimeouts == NULL );
        if ( p->vTimeouts )
           printf( "Fra_FraigInduction(): SAT solver timed out!\n" );
        // check if refinement has happened
//        p->pCla->fRefinement = (int)(nLitsOld != Fra_ClassesCountLits(p->pCla));
        if ( p->pCla->fRefinement && 
            nLitsOld == Fra_ClassesCountLits(p->pCla) && 
            nImpsOld == (p->pCla->vImps? Vec_IntSize(p->pCla->vImps) : 0) && 
            nHotsOld == (p->vOneHots? Fra_OneHotCount(p, p->vOneHots) : 0) )
        {
            printf( "Fra_FraigInduction(): Internal error. The result may not verify.\n" );
            break;
        }
    }
/*
    // verify implications using simulation
    if ( p->pCla->vImps && Vec_IntSize(p->pCla->vImps) )
    {
        int Temp;
        abctime clk = Abc_Clock();
        if ( Temp = Fra_ImpVerifyUsingSimulation( p ) )
            printf( "Implications failing the simulation test = %d (out of %d).  ", Temp, Vec_IntSize(p->pCla->vImps) );
        else
            printf( "All %d implications have passed the simulation test.  ", Vec_IntSize(p->pCla->vImps) );
        ABC_PRT( "Time", Abc_Clock() - clk );
    }
*/

    // move the classes into representatives and reduce AIG
clk2 = Abc_Clock();
    if ( p->pPars->fWriteImps && p->vOneHots && Fra_OneHotCount(p, p->vOneHots) )
    {
        extern void Ioa_WriteAiger( Aig_Man_t * pMan, char * pFileName, int fWriteSymbols, int fCompact );
        Aig_Man_t * pNew;
        char * pFileName = Ioa_FileNameGenericAppend( p->pManAig->pName, "_care.aig" );
        printf( "Care one-hotness clauses will be written into file \"%s\".\n", pFileName );
        pManAigNew = Aig_ManDupOrdered( pManAig );
        pNew = Fra_OneHotCreateExdc( p, p->vOneHots );
        Ioa_WriteAiger( pNew, pFileName, 0, 1 );
        Aig_ManStop( pNew );
    }
    else 
    {
    //    Fra_ClassesPrint( p->pCla, 1 );
        Fra_ClassesSelectRepr( p->pCla );
        Fra_ClassesCopyReprs( p->pCla, p->vTimeouts );
        pManAigNew = Aig_ManDupRepr( pManAig, 0 );
    }
    // add implications to the manager
//    if ( fWriteImps && p->pCla->vImps && Vec_IntSize(p->pCla->vImps) )
//        Fra_ImpRecordInManager( p, pManAigNew );
    // cleanup the new manager
    Aig_ManSeqCleanup( pManAigNew );
    // remove pointers to the dead nodes
//    Aig_ManForEachObj( pManAig, pObj, i )
//        if ( pObj->pData && Aig_ObjIsNone(pObj->pData) )
//            pObj->pData = NULL;
//    Aig_ManCountMergeRegs( pManAigNew );
p->timeTrav += Abc_Clock() - clk2;
p->timeTotal = Abc_Clock() - clk;
    // get the final stats
    p->nLitsEnd  = Fra_ClassesCountLits( p->pCla );
    p->nNodesEnd = Aig_ManNodeNum(pManAigNew);
    p->nRegsEnd  = Aig_ManRegNum(pManAigNew);
    // free the manager
finish:
    Fra_ManStop( p );
    // check the output
//    if ( Aig_ManCoNum(pManAigNew) - Aig_ManRegNum(pManAigNew) == 1 )
//        if ( Aig_ObjChild0( Aig_ManCo(pManAigNew,0) ) == Aig_ManConst0(pManAigNew) )
//            printf( "Proved output constant 0.\n" );
    pParams->nIters = nIter;
    return pManAigNew;
}